

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wi_stuff.cpp
# Opt level: O2

void WI_loadData(void)

{
  level_info_t *plVar1;
  
  FPatchInfo::Init(&entering,&gameinfo.mStatscreenEnteringFont);
  FPatchInfo::Init(&finished,&gameinfo.mStatscreenFinishedFont);
  FPatchInfo::Init(&mapname,&gameinfo.mStatscreenMapNameFont);
  if (((undefined1)gameinfo.gametype & GAME_DoomChex) != GAME_Any) {
    kills = FTextureManager::operator[](&TexMan,"WIOSTK");
    secret = FTextureManager::operator[](&TexMan,"WIOSTS");
    sp_secret = FTextureManager::operator[](&TexMan,"WISCRT2");
    items = FTextureManager::operator[](&TexMan,"WIOSTI");
    frags = FTextureManager::operator[](&TexMan,"WIFRGS");
    timepic = FTextureManager::operator[](&TexMan,"WITIME");
    sucks = FTextureManager::operator[](&TexMan,"WISUCKS");
    par = FTextureManager::operator[](&TexMan,"WIPAR");
    killers = FTextureManager::operator[](&TexMan,"WIKILRS");
    victims = FTextureManager::operator[](&TexMan,"WIVCTMS");
    total = FTextureManager::operator[](&TexMan,"WIMSTT");
    p = FTextureManager::operator[](&TexMan,"STPBANY");
  }
  FString::operator=(lnametexts,&level.LevelName);
  plVar1 = FindLevelInfo((wbs->next).Chars,true);
  if (plVar1 == (level_info_t *)0x0) {
    FString::operator=(lnametexts + 1,(char *)"");
  }
  else {
    level_info_t::LookupLevelName((level_info_t *)&stack0xfffffffffffffff0);
    FString::operator=(lnametexts + 1,(FString *)&stack0xfffffffffffffff0);
    FString::~FString((FString *)&stack0xfffffffffffffff0);
  }
  WI_LoadBackground(false);
  return;
}

Assistant:

void WI_loadData(void)
{
	entering.Init(gameinfo.mStatscreenEnteringFont);
	finished.Init(gameinfo.mStatscreenFinishedFont);
	mapname.Init(gameinfo.mStatscreenMapNameFont);

	if (gameinfo.gametype & GAME_DoomChex)
	{
		kills = TexMan["WIOSTK"];		// "kills"
		secret = TexMan["WIOSTS"];		// "scrt"
		sp_secret = TexMan["WISCRT2"];	// "secret"
		items = TexMan["WIOSTI"];		// "items"
		frags = TexMan["WIFRGS"];		// "frgs"
		timepic = TexMan["WITIME"];		// "time"
		sucks = TexMan["WISUCKS"];		// "sucks"
		par = TexMan["WIPAR"];			// "par"
		killers = TexMan["WIKILRS"];	// "killers" (vertical]
		victims = TexMan["WIVCTMS"];	// "victims" (horiz]
		total = TexMan["WIMSTT"];		// "total"
//		star = TexMan["STFST01"];		// your face
//		bstar = TexMan["STFDEAD0"];		// dead face
 		p = TexMan["STPBANY"];
	}
#if 0
	else if (gameinfo.gametype & GAME_Raven)
	{
		if (gameinfo.gametype == GAME_Heretic)
		{
			star = TexMan["FACEA0"];
			bstar = TexMan["FACEB0"];
		}
		else
		{
			star = BigFont->GetChar('*', NULL);
			bstar = star;
		}
	}
	else // Strife needs some handling, too!
	{
		star = BigFont->GetChar('*', NULL);
		bstar = star;
	}
#endif

	// Use the local level structure which can be overridden by hubs
	lnametexts[0] = level.LevelName;		

	level_info_t *li = FindLevelInfo(wbs->next);
	if (li) lnametexts[1] = li->LookupLevelName();
	else lnametexts[1] = "";

	WI_LoadBackground(false);
}